

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplugin_p.h
# Opt level: O2

bool __thiscall QPluginParsedMetaData::setError(QPluginParsedMetaData *this,QString *errorString)

{
  long in_FS_OFFSET;
  QCborValue local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QCborValue::QCborValue((QCborValue *)&local_30,errorString);
  QCborValue::operator=((QCborValue *)this,&local_30);
  QCborValue::~QCborValue((QCborValue *)&local_30);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return false;
  }
  __stack_chk_fail();
}

Assistant:

bool setError(const QString &errorString) Q_DECL_COLD_FUNCTION
    {
        data = errorString;
        return false;
    }